

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.hpp
# Opt level: O0

void __thiscall
Kernel::NonVariableNonTypeIterator::NonVariableNonTypeIterator
          (NonVariableNonTypeIterator *this,Term *term,bool includeSelf)

{
  byte in_DL;
  Term *in_RDI;
  NonVariableNonTypeIterator *in_stack_00000010;
  Stack<Kernel::Term_*> *this_00;
  size_t in_stack_ffffffffffffffd8;
  Stack<Kernel::Term_*> *in_stack_ffffffffffffffe0;
  
  Lib::IteratorCore<Kernel::Term_*>::IteratorCore((IteratorCore<Kernel::Term_*> *)in_RDI);
  in_RDI->_vptr_Term = (_func_int **)&PTR__NonVariableNonTypeIterator_01320720;
  this_00 = (Stack<Kernel::Term_*> *)&in_RDI->_weight;
  Lib::Stack<Kernel::Term_*>::Stack(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *(undefined4 *)&in_RDI[1]._vptr_Term = 0;
  Lib::Stack<Kernel::Term_*>::push(this_00,in_RDI);
  if ((in_DL & 1) == 0) {
    next(in_stack_00000010);
  }
  return;
}

Assistant:

NonVariableNonTypeIterator(Term* term, bool includeSelf=false)
  : _stack(8),
    _added(0)
  {
    _stack.push(term);
    if (!includeSelf) {
      NonVariableNonTypeIterator::next();
    }
  }